

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

bool __thiscall irr::video::COpenGLDriver::genericDriverInit(COpenGLDriver *this)

{
  array<irr::video::COpenGLDriver::SUserClipPlane> *this_00;
  ulong uVar1;
  long *in_RDI;
  double __x;
  double __x_00;
  double __x_01;
  u32 maj;
  char buf [32];
  u32 i;
  GLubyte *vendor;
  GLubyte *renderer;
  s32 pos;
  undefined1 in_stack_00001ce7;
  IContextManager *in_stack_00001ce8;
  COpenGLExtensionHandler *in_stack_00001cf0;
  u32 in_stack_fffffffffffffdd8;
  GLenum in_stack_fffffffffffffddc;
  COpenGLExtensionHandler *in_stack_fffffffffffffde0;
  vector2df *scale;
  vector2df *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  string<char> *in_stack_fffffffffffffdf8;
  long *plVar2;
  f32 rotateRad;
  COpenGLDriver *this_01;
  vector2d<float> local_1ec;
  undefined1 in_stack_fffffffffffffe1f;
  float in_stack_fffffffffffffe20;
  float in_stack_fffffffffffffe24;
  float in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  vector2d<float> in_stack_fffffffffffffe30;
  SColor local_1c8;
  vector3d<float> local_1c4;
  vector3d<float> local_1b8;
  S3DVertex local_1ac;
  vector2d<float> local_188;
  SColor local_180;
  vector3d<float> local_17c;
  vector3d<float> local_170;
  S3DVertex local_164;
  vector2d<float> local_140;
  SColor local_138;
  vector3d<float> local_134;
  vector3d<float> local_128;
  S3DVertex local_11c;
  vector2d<float> local_f8;
  SColor local_f0;
  vector3d<float> local_ec;
  vector3d<float> local_e0;
  S3DVertex local_d4;
  SColorf local_b0 [2];
  uint local_8c;
  char local_88 [36];
  uint local_64;
  long local_60;
  long local_58;
  s32 local_2c;
  
  if (in_RDI[0x21e] != 0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)(in_RDI[0x21e] + *(long *)(*(long *)in_RDI[0x21e] + -0x18)));
  }
  core::string<char>::operator=(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  this_01 = (COpenGLDriver *)(in_RDI + 0x17e);
  glGetString(0x1f02);
  core::string<char>::string<unsigned_char>
            ((string<char> *)in_stack_fffffffffffffde0,
             (uchar *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  core::string<char>::append
            ((string<char> *)in_stack_fffffffffffffde0,
             (string<char> *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  core::string<char>::~string((string<char> *)0x338ddf);
  local_2c = core::string<char>::findNext
                       ((string<char> *)in_stack_fffffffffffffde0,
                        (char)(in_stack_fffffffffffffddc >> 0x18),in_stack_fffffffffffffdd8);
  if (local_2c != -1) {
    core::string<char>::subString
              ((string<char> *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (u32)in_stack_fffffffffffffe24,(s32)in_stack_fffffffffffffe20,
               (bool)in_stack_fffffffffffffe1f);
    core::string<char>::operator=
              ((string<char> *)in_stack_fffffffffffffde8,(string<char> *)in_stack_fffffffffffffde0);
    core::string<char>::~string((string<char> *)0x338e57);
  }
  CNullDriver::printVersion(&this_01->super_CNullDriver);
  local_58 = glGetString(0x1f01);
  local_60 = glGetString(0x1f00);
  if ((local_58 != 0) && (local_60 != 0)) {
    os::Printer::log(__x);
    core::string<char>::operator=(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  }
  COpenGLExtensionHandler::initExtensions
            (in_stack_00001cf0,in_stack_00001ce8,(bool)in_stack_00001ce7);
  plVar2 = (long *)in_RDI[0x17d];
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  this_00 = (array<irr::video::COpenGLDriver::SUserClipPlane> *)operator_new(0xd8);
  COpenGLCacheHandler::COpenGLCacheHandler
            ((COpenGLCacheHandler *)in_stack_fffffffffffffde0,
             (COpenGLDriver *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  in_RDI[0x17d] = (long)this_00;
  uVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,0x12);
  if ((uVar1 & 1) == 0) {
    os::Printer::log((Printer *)"GLSL not available.",__x_00);
  }
  else {
    local_8c = *(ushort *)((long)in_RDI + 0x4d2) / 100;
    snprintf(local_88,0x20,"%u.%u",(ulong)local_8c,
             (ulong)((uint)*(ushort *)((long)in_RDI + 0x4d2) + local_8c * -100));
    os::Printer::log(__x_01);
  }
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))
            ((long *)in_RDI[0x3c],"MaxTextures",*(undefined1 *)((long)in_RDI + 0x6c3));
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))
            ((long *)in_RDI[0x3c],"MaxSupportedTextures",*(undefined1 *)((long)in_RDI + 0x6c3));
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))
            ((long *)in_RDI[0x3c],"MaxLights",*(undefined1 *)((long)in_RDI + 0x49a));
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))
            ((long *)in_RDI[0x3c],"MaxAnisotropy",*(undefined1 *)((long)in_RDI + 0x49b));
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))
            ((long *)in_RDI[0x3c],"MaxUserClipPlanes",*(undefined1 *)((long)in_RDI + 0x49c));
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))
            ((long *)in_RDI[0x3c],"MaxAuxBuffers",*(undefined1 *)((long)in_RDI + 0x49d));
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))
            ((long *)in_RDI[0x3c],"MaxMultipleRenderTargets",*(undefined1 *)((long)in_RDI + 0x6c2));
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))((long *)in_RDI[0x3c],"MaxIndices",(int)in_RDI[0x94]);
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))
            ((long *)in_RDI[0x3c],"MaxTextureSize",*(undefined4 *)((long)in_RDI + 0x4a4));
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))
            ((long *)in_RDI[0x3c],"MaxGeometryVerticesOut",(int)in_RDI[0x95]);
  (**(code **)(*(long *)in_RDI[0x3c] + 0x68))
            (*(undefined4 *)((long)in_RDI + 0x4ac),(long *)in_RDI[0x3c],"MaxTextureLODBias");
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))((long *)in_RDI[0x3c],"Version",(short)in_RDI[0x9a]);
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))
            ((long *)in_RDI[0x3c],"ShaderLanguageVersion",*(undefined2 *)((long)in_RDI + 0x4d2));
  (**(code **)(*(long *)in_RDI[0x3c] + 0x40))
            ((long *)in_RDI[0x3c],"AntiAlias",*(undefined1 *)((long)in_RDI + 0xdf6));
  glPixelStorei(0xd05,1);
  core::array<irr::video::COpenGLDriver::SUserClipPlane>::reallocate
            (this_00,(u32)((ulong)in_stack_fffffffffffffde8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffde8 >> 0x18,0));
  for (local_64 = 0; local_64 < *(byte *)((long)in_RDI + 0x49c); local_64 = local_64 + 1) {
    in_stack_fffffffffffffde8 = (vector2df *)(in_RDI + 0x1ed);
    SUserClipPlane::SUserClipPlane((SUserClipPlane *)in_stack_fffffffffffffde0);
    core::array<irr::video::COpenGLDriver::SUserClipPlane>::push_back
              ((array<irr::video::COpenGLDriver::SUserClipPlane> *)in_stack_fffffffffffffde0,
               (SUserClipPlane *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  }
  for (local_64 = 0; rotateRad = (f32)((ulong)plVar2 >> 0x20), local_64 < 7; local_64 = local_64 + 1
      ) {
    (**(code **)(*in_RDI + 0x30))(in_RDI,local_64,core::IdentityMatrix);
  }
  SColorf::SColorf(local_b0,0.0,0.0,0.0,0.0);
  (**(code **)(*in_RDI + 0x308))(in_RDI,local_b0);
  if ((*(byte *)((long)in_RDI + 0x5d7) & 1) != 0) {
    glLightModeli(0x81f8,0x81fa);
  }
  glLightModeli(0xb51,1);
  glClearDepth(0x3ff0000000000000);
  glHint(0xc50,0x1102);
  glFrontFace(0x900);
  COpenGLExtensionHandler::extGlProvokingVertex(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc)
  ;
  core::vector3d<float>::vector3d(&local_e0,-1.0,1.0,0.0);
  core::vector3d<float>::vector3d(&local_ec,0.0,0.0,0.0);
  SColor::SColor(&local_f0,0xff,0xff,0xff,0xff);
  core::vector2d<float>::vector2d(&local_f8,0.0,1.0);
  S3DVertex::S3DVertex(&local_d4,&local_e0,&local_ec,local_f0,&local_f8);
  memcpy(in_RDI + 0x20c,&local_d4,0x24);
  core::vector3d<float>::vector3d(&local_128,1.0,1.0,0.0);
  core::vector3d<float>::vector3d(&local_134,0.0,0.0,0.0);
  SColor::SColor(&local_138,0xff,0xff,0xff,0xff);
  core::vector2d<float>::vector2d(&local_140,1.0,1.0);
  S3DVertex::S3DVertex(&local_11c,&local_128,&local_134,local_138,&local_140);
  memcpy((void *)((long)in_RDI + 0x1084),&local_11c,0x24);
  core::vector3d<float>::vector3d(&local_170,1.0,-1.0,0.0);
  core::vector3d<float>::vector3d(&local_17c,0.0,0.0,0.0);
  SColor::SColor(&local_180,0xff,0xff,0xff,0xff);
  core::vector2d<float>::vector2d(&local_188,1.0,0.0);
  S3DVertex::S3DVertex(&local_164,&local_170,&local_17c,local_180,&local_188);
  memcpy(in_RDI + 0x215,&local_164,0x24);
  core::vector3d<float>::vector3d(&local_1b8,-1.0,-1.0,0.0);
  core::vector3d<float>::vector3d(&local_1c4,0.0,0.0,0.0);
  SColor::SColor(&local_1c8,0xff,0xff,0xff,0xff);
  core::vector2d<float>::vector2d((vector2d<float> *)&stack0xfffffffffffffe30,0.0,0.0);
  S3DVertex::S3DVertex
            (&local_1ac,&local_1b8,&local_1c4,local_1c8,(vector2df *)&stack0xfffffffffffffe30);
  memcpy((void *)((long)in_RDI + 0x10cc),&local_1ac,0x24);
  createMaterialRenderers(this_01);
  setRenderStates3DMode((COpenGLDriver *)in_stack_fffffffffffffe30);
  (**(code **)(*in_RDI + 0x1c0))
            ((int)in_RDI[0x36],*(undefined4 *)((long)in_RDI + 0x1b4),(int)in_RDI[0x37],in_RDI,
             *(undefined4 *)((long)in_RDI + 0x1bc),*(undefined4 *)((long)in_RDI + 0x44c),
             *(byte *)(in_RDI + 0x8a) & 1,*(byte *)((long)in_RDI + 0x451) & 1);
  scale = (vector2df *)(in_RDI + 0x1f5);
  core::vector2d<float>::vector2d((vector2d<float> *)&stack0xfffffffffffffe24,0.0,0.0);
  core::vector2d<float>::vector2d((vector2d<float> *)&stack0xfffffffffffffe1c,0.0,1.0);
  core::vector2d<float>::vector2d(&local_1ec,1.0,-1.0);
  core::CMatrix4<float>::buildTextureTransform
            ((CMatrix4<float> *)this_01,rotateRad,(vector2df *)this_00,in_stack_fffffffffffffde8,
             scale);
  *(undefined1 *)((long)in_RDI + 0xdf4) = 1;
  return true;
}

Assistant:

bool COpenGLDriver::genericDriverInit()
{
	if (ContextManager)
		ContextManager->grab();

	Name = "OpenGL ";
	Name.append(glGetString(GL_VERSION));
	s32 pos = Name.findNext(' ', 7);
	if (pos != -1)
		Name = Name.subString(0, pos);
	printVersion();

	// print renderer information
	const GLubyte *renderer = glGetString(GL_RENDERER);
	const GLubyte *vendor = glGetString(GL_VENDOR);
	if (renderer && vendor) {
		os::Printer::log(reinterpret_cast<const c8 *>(renderer), reinterpret_cast<const c8 *>(vendor), ELL_INFORMATION);
		VendorName = reinterpret_cast<const c8 *>(vendor);
	}

	u32 i;

	// load extensions
	initExtensions(ContextManager, Params.Stencilbuffer);

	// reset cache handler
	delete CacheHandler;
	CacheHandler = new COpenGLCacheHandler(this);

	if (queryFeature(EVDF_ARB_GLSL)) {
		char buf[32];
		const u32 maj = ShaderLanguageVersion / 100;
		snprintf_irr(buf, 32, "%u.%u", maj, ShaderLanguageVersion - maj * 100);
		os::Printer::log("GLSL version", buf, ELL_INFORMATION);
	} else
		os::Printer::log("GLSL not available.", ELL_INFORMATION);
	DriverAttributes->setAttribute("MaxTextures", (s32)Feature.MaxTextureUnits);
	DriverAttributes->setAttribute("MaxSupportedTextures", (s32)Feature.MaxTextureUnits);
	DriverAttributes->setAttribute("MaxLights", MaxLights);
	DriverAttributes->setAttribute("MaxAnisotropy", MaxAnisotropy);
	DriverAttributes->setAttribute("MaxUserClipPlanes", MaxUserClipPlanes);
	DriverAttributes->setAttribute("MaxAuxBuffers", MaxAuxBuffers);
	DriverAttributes->setAttribute("MaxMultipleRenderTargets", (s32)Feature.MultipleRenderTarget);
	DriverAttributes->setAttribute("MaxIndices", (s32)MaxIndices);
	DriverAttributes->setAttribute("MaxTextureSize", (s32)MaxTextureSize);
	DriverAttributes->setAttribute("MaxGeometryVerticesOut", (s32)MaxGeometryVerticesOut);
	DriverAttributes->setAttribute("MaxTextureLODBias", MaxTextureLODBias);
	DriverAttributes->setAttribute("Version", Version);
	DriverAttributes->setAttribute("ShaderLanguageVersion", ShaderLanguageVersion);
	DriverAttributes->setAttribute("AntiAlias", AntiAlias);

	glPixelStorei(GL_PACK_ALIGNMENT, 1);

	UserClipPlanes.reallocate(MaxUserClipPlanes);
	for (i = 0; i < MaxUserClipPlanes; ++i)
		UserClipPlanes.push_back(SUserClipPlane());

	for (i = 0; i < ETS_COUNT; ++i)
		setTransform(static_cast<E_TRANSFORMATION_STATE>(i), core::IdentityMatrix);

	setAmbientLight(SColorf(0.0f, 0.0f, 0.0f, 0.0f));
#ifdef GL_EXT_separate_specular_color
	if (FeatureAvailable[IRR_EXT_separate_specular_color])
		glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL, GL_SEPARATE_SPECULAR_COLOR);
#endif
	glLightModeli(GL_LIGHT_MODEL_LOCAL_VIEWER, 1);

	// This is a fast replacement for NORMALIZE_NORMALS
	//	if ((Version>101) || FeatureAvailable[IRR_EXT_rescale_normal])
	//		glEnable(GL_RESCALE_NORMAL_EXT);

	glClearDepth(1.0);
	glHint(GL_PERSPECTIVE_CORRECTION_HINT, GL_NICEST);
	glFrontFace(GL_CW);
	// adjust flat coloring scheme to DirectX version
#if defined(GL_ARB_provoking_vertex) || defined(GL_EXT_provoking_vertex)
	extGlProvokingVertex(GL_FIRST_VERTEX_CONVENTION_EXT);
#endif

	// Create built-in 2D quad for 2D rendering (both quads and lines).
	Quad2DVertices[0] = S3DVertex(core::vector3df(-1.0f, 1.0f, 0.0f), core::vector3df(0.0f, 0.0f, 0.0f), SColor(255, 255, 255, 255), core::vector2df(0.0f, 1.0f));
	Quad2DVertices[1] = S3DVertex(core::vector3df(1.0f, 1.0f, 0.0f), core::vector3df(0.0f, 0.0f, 0.0f), SColor(255, 255, 255, 255), core::vector2df(1.0f, 1.0f));
	Quad2DVertices[2] = S3DVertex(core::vector3df(1.0f, -1.0f, 0.0f), core::vector3df(0.0f, 0.0f, 0.0f), SColor(255, 255, 255, 255), core::vector2df(1.0f, 0.0f));
	Quad2DVertices[3] = S3DVertex(core::vector3df(-1.0f, -1.0f, 0.0f), core::vector3df(0.0f, 0.0f, 0.0f), SColor(255, 255, 255, 255), core::vector2df(0.0f, 0.0f));

	// create material renderers
	createMaterialRenderers();

	// set the renderstates
	setRenderStates3DMode();

	// set fog mode
	setFog(FogColor, FogType, FogStart, FogEnd, FogDensity, PixelFog, RangeFog);

	// create matrix for flipping textures
	TextureFlipMatrix.buildTextureTransform(0.0f, core::vector2df(0, 0), core::vector2df(0, 1.0f), core::vector2df(1.0f, -1.0f));

	// We need to reset once more at the beginning of the first rendering.
	// This fixes problems with intermediate changes to the material during texture load.
	ResetRenderStates = true;

	return true;
}